

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_macro5.c
# Opt level: O0

int dwarf_macro_context_head
              (Dwarf_Macro_Context head,Dwarf_Half *version,Dwarf_Unsigned *mac_offset,
              Dwarf_Unsigned *mac_len,Dwarf_Unsigned *mac_header_len,uint *flags,
              Dwarf_Bool *has_line_offset,Dwarf_Unsigned *line_offset,Dwarf_Bool *has_offset_size_64
              ,Dwarf_Bool *has_operands_table,Dwarf_Half *opcode_count,Dwarf_Error *error)

{
  Dwarf_Debug local_48;
  Dwarf_Debug dbg;
  uint *flags_local;
  Dwarf_Unsigned *mac_header_len_local;
  Dwarf_Unsigned *mac_len_local;
  Dwarf_Unsigned *mac_offset_local;
  Dwarf_Half *version_local;
  Dwarf_Macro_Context head_local;
  
  local_48 = (Dwarf_Debug)0x0;
  if ((head == (Dwarf_Macro_Context)0x0) || (head->mc_sentinel != 0xada)) {
    if (head != (Dwarf_Macro_Context)0x0) {
      local_48 = head->mc_dbg;
    }
    _dwarf_error_string(local_48,error,0x142,
                        "DW_DLE_BAD_MACRO_HEADER_POINTER  NULL header or corrupt header");
    head_local._4_4_ = 1;
  }
  else {
    *version = head->mc_version_number;
    *mac_offset = head->mc_section_offset;
    *mac_len = head->mc_total_length;
    *mac_header_len = (ulong)head->mc_macro_header_length;
    *flags = (uint)head->mc_flags;
    *line_offset = head->mc_debug_line_offset;
    *has_line_offset = head->mc_debug_line_offset_flag;
    *has_offset_size_64 = head->mc_offset_size_flag;
    *has_operands_table = head->mc_operands_table_flag;
    *opcode_count = (ushort)head->mc_opcode_count;
    head_local._4_4_ = 0;
  }
  return head_local._4_4_;
}

Assistant:

int
dwarf_macro_context_head(Dwarf_Macro_Context head,
    Dwarf_Half     * version,
    Dwarf_Unsigned * mac_offset,
    Dwarf_Unsigned * mac_len,
    Dwarf_Unsigned * mac_header_len,
    unsigned *       flags,
    Dwarf_Bool *     has_line_offset,
    Dwarf_Unsigned * line_offset,
    Dwarf_Bool *     has_offset_size_64,
    Dwarf_Bool *     has_operands_table,
    Dwarf_Half *     opcode_count,
    Dwarf_Error *error)
{
    Dwarf_Debug dbg = 0;

    CHECKNULLCONTEXT(head,dbg,error);
    *version = head->mc_version_number;
    *mac_offset = head->mc_section_offset;
    *mac_len    = head->mc_total_length;
    *mac_header_len = head->mc_macro_header_length;
    *flags = head->mc_flags;
    *line_offset = head->mc_debug_line_offset;
    *has_line_offset = head->mc_debug_line_offset_flag;
    *has_offset_size_64 = head->mc_offset_size_flag;
    *has_operands_table = head->mc_operands_table_flag;
    *opcode_count = head->mc_opcode_count;
    return DW_DLV_OK;
}